

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

void __thiscall OpenGliderConnection::APRSMain(OpenGliderConnection *this)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  SOCKET SVar7;
  int iVar8;
  SOCKET SVar9;
  undefined8 uVar10;
  int *piVar11;
  NetRuntimeError *this_00;
  char *__s;
  ulong __n;
  long *in_RDI;
  timeval *__timeout;
  SOCKET *s;
  SOCKET *__end1;
  SOCKET *__begin1;
  SOCKET (*__range1) [2];
  runtime_error *e;
  long rcvdBytes;
  int retval;
  timeval timeout;
  fd_set *__arr;
  uint __i;
  fd_set sRead;
  positionTy currPos;
  double dist_km;
  int maxSock;
  ThreadSettings TS;
  undefined4 in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  ThreadSettings *in_stack_fffffffffffffc00;
  allocator<char> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  undefined4 in_stack_fffffffffffffc78;
  SOCKET in_stack_fffffffffffffc7c;
  OpenGliderConnection *in_stack_fffffffffffffc80;
  OpenGliderConnection *in_stack_fffffffffffffc90;
  long *local_2e8;
  undefined1 local_2b0 [78];
  undefined1 local_262;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_261;
  undefined1 local_23a;
  ssize_t local_218;
  undefined1 local_20a;
  undefined1 local_1e2;
  int local_1bc;
  timeval local_1b8;
  ulong *local_1a0;
  uint local_194;
  ulong local_190 [12];
  uint in_stack_fffffffffffffed4;
  size_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  SocketNetworking *in_stack_fffffffffffffef0;
  long lStack_108;
  long local_100;
  long lStack_f8;
  long local_f0;
  long lStack_e8;
  long local_e0;
  long lStack_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  double local_80;
  int local_78;
  undefined1 local_72;
  int local_50 [5];
  allocator<char> local_39;
  string local_38 [56];
  
  ThreadSettings::ThreadSettings
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,
             (char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  std::__cxx11::string::clear();
  *(undefined4 *)(in_RDI + 0x57) = 0x7fc00000;
  *(undefined4 *)((long)in_RDI + 700) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  XPMP2::SocketNetworking::Connect
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  SVar7 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
  local_50[0] = SVar7 + 1;
  iVar8 = pipe((int *)(in_RDI + 0x52));
  if (iVar8 < 0) {
    local_72 = 1;
    uVar10 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    XPMP2::NetRuntimeError::NetRuntimeError
              ((NetRuntimeError *)in_stack_fffffffffffffc80,
               (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    local_72 = 0;
    __cxa_throw(uVar10,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl((int)in_RDI[0x52],4,0x800);
  local_78 = (int)in_RDI[0x52] + 1;
  piVar11 = std::max<int>(local_50,&local_78);
  local_50[0] = *piVar11;
  iVar8 = DataRefs::GetFdStdDistance_km(&dataRefs);
  local_80 = (double)iVar8;
  DataRefs::GetViewPos();
  in_RDI[0x51] = local_d0;
  in_RDI[0x4f] = local_e0;
  in_RDI[0x50] = lStack_d8;
  in_RDI[0x4d] = local_f0;
  in_RDI[0x4e] = lStack_e8;
  in_RDI[0x4b] = local_100;
  in_RDI[0x4c] = lStack_f8;
  in_RDI[0x49] = (long)in_stack_fffffffffffffef0;
  in_RDI[0x4a] = lStack_108;
  local_88 = in_RDI[0x51];
  local_c8 = in_RDI[0x49];
  lStack_c0 = in_RDI[0x4a];
  local_b8 = in_RDI[0x4b];
  lStack_b0 = in_RDI[0x4c];
  local_a8 = in_RDI[0x4d];
  lStack_a0 = in_RDI[0x4e];
  local_98 = in_RDI[0x4f];
  lStack_90 = in_RDI[0x50];
  bVar4 = APRSDoLogin(in_stack_fffffffffffffc80);
  if (!bVar4) {
    (**(code **)(*in_RDI + 0x38))(in_RDI,0,1);
  }
  while( true ) {
    bVar5 = (**(code **)(*in_RDI + 0x20))();
    bVar4 = false;
    if ((bVar5 & 1) != 0) {
      bVar6 = XPMP2::SocketNetworking::isOpen((SocketNetworking *)(in_RDI + 0x3d));
      bVar4 = false;
      if (bVar6) {
        dVar2 = positionTy::dist((positionTy *)
                                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                 (positionTy *)
                                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        bVar4 = dVar2 / 1000.0 < local_80 * 0.2;
      }
    }
    if (!bVar4) break;
    local_1a0 = local_190;
    for (local_194 = 0; local_194 < 0x10; local_194 = local_194 + 1) {
      local_1a0[local_194] = 0;
    }
    SVar9 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
    SVar7 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
    if (SVar7 < 0) {
      SVar7 = SVar7 + 0x3f;
    }
    local_190[SVar7 >> 6] = local_190[SVar7 >> 6] | 1L << ((byte)SVar9 & 0x3f);
    iVar8 = (int)in_RDI[0x52];
    iVar3 = iVar8;
    if (iVar8 < 0) {
      iVar3 = iVar8 + 0x3f;
    }
    local_190[iVar3 >> 6] = local_190[iVar3 >> 6] | 1L << ((ulong)(byte)iVar8 & 0x3f);
    local_1b8.tv_sec = 0x3c;
    local_1b8.tv_usec = 0;
    __timeout = &local_1b8;
    local_1bc = select(local_50[0],(fd_set *)local_190,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    iVar8 = (int)__timeout;
    bVar5 = (**(code **)(*in_RDI + 0x20))();
    if ((bVar5 & 1) == 0) break;
    if (local_1bc == -1) {
      local_1e2 = 1;
      uVar10 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      XPMP2::NetRuntimeError::NetRuntimeError
                ((NetRuntimeError *)in_stack_fffffffffffffc80,
                 (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      local_1e2 = 0;
      __cxa_throw(uVar10,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if (local_1bc == 0) {
      local_20a = 1;
      this_00 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      XPMP2::NetRuntimeError::NetRuntimeError
                (this_00,(string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      local_20a = 0;
      __cxa_throw(this_00,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError
                 );
    }
    if (0 < local_1bc) {
      in_stack_fffffffffffffc7c =
           XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
      SVar7 = in_stack_fffffffffffffc7c;
      if (in_stack_fffffffffffffc7c < 0) {
        SVar7 = in_stack_fffffffffffffc7c + 0x3f;
      }
      uVar1 = local_190[SVar7 >> 6];
      SVar7 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
      __n = 1L << ((byte)((long)SVar7 % 0x40) & 0x3f);
      if ((uVar1 & __n) != 0) {
        local_218 = XPMP2::SocketNetworking::recv
                              ((SocketNetworking *)(in_RDI + 0x3d),0,(void *)0x0,__n,iVar8);
        if (local_218 < 1) {
          local_262 = 1;
          __s = (char *)__cxa_allocate_exception(0x50);
          this_01 = &local_261;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffc20);
          XPMP2::NetRuntimeError::NetRuntimeError
                    ((NetRuntimeError *)in_stack_fffffffffffffc80,
                     (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          local_262 = 0;
          __cxa_throw(__s,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError
                     );
        }
        XPMP2::SocketNetworking::getBuf((SocketNetworking *)(in_RDI + 0x3d));
        in_stack_fffffffffffffc4f =
             APRSProcessData((OpenGliderConnection *)
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                             in_stack_fffffffffffffc40);
        if (!(bool)in_stack_fffffffffffffc4f) {
          local_23a = 1;
          uVar10 = __cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          XPMP2::NetRuntimeError::NetRuntimeError
                    ((NetRuntimeError *)in_stack_fffffffffffffc80,
                     (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          local_23a = 0;
          __cxa_throw(uVar10,&XPMP2::NetRuntimeError::typeinfo,
                      XPMP2::NetRuntimeError::~NetRuntimeError);
        }
      }
    }
    bVar4 = CheckEverySoOften((float *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                              ,in_stack_fffffffffffffbec);
    if (bVar4) {
      APRSSendKeepAlive(in_stack_fffffffffffffc90);
    }
    iVar8 = DataRefs::GetFdStdDistance_km(&dataRefs);
    local_80 = (double)iVar8;
    DataRefs::GetViewPos();
    memcpy(&local_c8,local_2b0,0x48);
  }
  for (local_2e8 = in_RDI + 0x52; local_2e8 != in_RDI + 0x53;
      local_2e8 = (long *)((long)local_2e8 + 4)) {
    if ((int)*local_2e8 != -1) {
      close((int)*local_2e8);
    }
    *(int *)local_2e8 = -1;
  }
  XPMP2::TCPConnection::Close
            ((TCPConnection *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  *(undefined4 *)(in_RDI + 0x57) = 0x7fc00000;
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  return;
}

Assistant:

void OpenGliderConnection::APRSMain ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_OGN_APRS", LC_ALL_MASK);
    
    try {
        // clear data
        aprsData.clear();
        aprsLastData = NAN;
        aprsLastKeepAlive = 0;
        // open a TCP connection to APRS.glidernet.org
        tcpAprs.Connect(OGN_APRS_SERVER, OGN_APRS_PORT, OGN_APRS_BUF_SIZE, unsigned(OGN_APRS_TIMEOUT_S * 1000));
        int maxSock = (int)tcpAprs.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(aprsPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(aprsPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, aprsPipe[0]+1);
#endif
        
        // Login
        double dist_km = dataRefs.GetFdStdDistance_km();
        positionTy currPos = aprsPos = dataRefs.GetViewPos();
        if (!APRSDoLogin()) {
            SetValid(false, true);
        }
        
        // *** Main Loop ***
        while (shallRun() && tcpAprs.isOpen() &&
               // test for camera position not too far away from login's position
               aprsPos.dist(currPos) / M_per_KM < 0.2 * dist_km)
        {
            // wait for some signal on either socket (APRS or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpAprs.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(aprsPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { OGN_APRS_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpAprs.getSocket(), &sRead))
            {
                // read APRS message
                long rcvdBytes = tcpAprs.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // have it processed
                    if (!APRSProcessData(tcpAprs.getBuf()))
                        throw XPMP2::NetRuntimeError("APRSProcessData failed");
                }
                else
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket ");
            }

            // Send a keep-alive every 15 minutes
            if (CheckEverySoOften(aprsLastKeepAlive, OGN_APRS_SEND_KEEPALV))
                APRSSendKeepAlive();
            
            // Update position information for test of distance to camera
            dist_km = dataRefs.GetFdStdDistance_km();
            currPos = dataRefs.GetViewPos();
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                OGN_APRS_SERVER, std::to_string(OGN_APRS_PORT).c_str(),
                e.what());
        // Stop this connection attempt
        if (GetErrCnt() == CH_MAC_ERR_CNT) {         // too bad already?
            bFailoverToHttp = true; // we fail over to the HTTP way of things
            SetValid(true);         // this resets the error count
        } else
            IncErrCnt();
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: aprsPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpAprs.Close();
    aprsLastData = NAN;
}